

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_ClassArray<ON_PlugInRef> * __thiscall
ON_ClassArray<ON_PlugInRef>::operator=
          (ON_ClassArray<ON_PlugInRef> *this,ON_ClassArray<ON_PlugInRef> *src)

{
  ON_wString *src_00;
  int iVar1;
  ON_PlugInRef *pOVar2;
  ON_PlugInRef *pOVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  long lVar7;
  long lVar8;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      if ((this->m_a != (ON_PlugInRef *)0x0) &&
         (iVar1 = src->m_count, this->m_count = iVar1, 0 < iVar1)) {
        lVar8 = 0x70;
        lVar7 = 0;
        do {
          pOVar2 = src->m_a;
          pOVar3 = this->m_a;
          src_00 = (ON_wString *)((long)(&pOVar2->m_plugin_id + -5) + lVar8);
          pwVar4 = src_00[-4].m_s;
          pwVar5 = src_00[-3].m_s;
          pwVar6 = src_00[-1].m_s;
          *(wchar_t **)((long)(&pOVar3->m_plugin_id + -6) + lVar8) = src_00[-2].m_s;
          *(wchar_t **)((pOVar3->m_plugin_id).Data4 + lVar8 + -0x60) = pwVar6;
          *(wchar_t **)((long)(&pOVar3->m_plugin_id + -7) + lVar8) = pwVar4;
          *(wchar_t **)((pOVar3->m_plugin_id).Data4 + lVar8 + -0x70) = pwVar5;
          ON_wString::operator=((ON_wString *)((long)(&pOVar3->m_plugin_id + -5) + lVar8),src_00);
          ON_wString::operator=
                    ((ON_wString *)((pOVar3->m_plugin_id).Data4 + lVar8 + -0x50),
                     (ON_wString *)((pOVar2->m_plugin_id).Data4 + lVar8 + -0x50));
          ON_wString::operator=
                    ((ON_wString *)((long)(&pOVar3->m_plugin_id + -4) + lVar8),
                     (ON_wString *)((long)(&pOVar2->m_plugin_id + -4) + lVar8));
          ON_wString::operator=
                    ((ON_wString *)((pOVar3->m_plugin_id).Data4 + lVar8 + -0x40),
                     (ON_wString *)((pOVar2->m_plugin_id).Data4 + lVar8 + -0x40));
          ON_wString::operator=
                    ((ON_wString *)((long)(&pOVar3->m_plugin_id + -3) + lVar8),
                     (ON_wString *)((long)(&pOVar2->m_plugin_id + -3) + lVar8));
          ON_wString::operator=
                    ((ON_wString *)((pOVar3->m_plugin_id).Data4 + lVar8 + -0x30),
                     (ON_wString *)((pOVar2->m_plugin_id).Data4 + lVar8 + -0x30));
          ON_wString::operator=
                    ((ON_wString *)((long)(&pOVar3->m_plugin_id + -2) + lVar8),
                     (ON_wString *)((long)(&pOVar2->m_plugin_id + -2) + lVar8));
          ON_wString::operator=
                    ((ON_wString *)((pOVar3->m_plugin_id).Data4 + lVar8 + -0x20),
                     (ON_wString *)((pOVar2->m_plugin_id).Data4 + lVar8 + -0x20));
          ON_wString::operator=
                    ((ON_wString *)((long)(&pOVar3->m_plugin_id + -1) + lVar8),
                     (ON_wString *)((long)(&pOVar2->m_plugin_id + -1) + lVar8));
          ON_wString::operator=
                    ((ON_wString *)((pOVar3->m_plugin_id).Data4 + lVar8 + -0x10),
                     (ON_wString *)((pOVar2->m_plugin_id).Data4 + lVar8 + -0x10));
          ON_wString::operator=
                    ((ON_wString *)((pOVar3->m_plugin_id).Data4 + lVar8 + -8),
                     (ON_wString *)((pOVar2->m_plugin_id).Data4 + lVar8 + -8));
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0x78;
        } while (lVar7 < this->m_count);
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}